

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O3

void __thiscall
google::protobuf::internal::ExtensionSet::SetAllocatedMessage
          (ExtensionSet *this,int number,FieldType type,FieldDescriptor *descriptor,
          MessageLite *message)

{
  ThreadSafeArena *this_00;
  Arena *pAVar1;
  btree_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>_>
  *this_01;
  short sVar2;
  anon_union_8_9_fdc4a54a_for_Extension_0 this_02;
  AllocatedData *pAVar3;
  Extension *pEVar4;
  MessageLite *this_03;
  undefined1 *puVar5;
  long lVar6;
  uint extraout_EDX;
  undefined7 in_register_00000011;
  undefined8 extraout_RDX;
  long lVar7;
  ThreadSafeArena *pTVar8;
  int iVar9;
  ExtensionSet *pEVar10;
  ExtensionSet *this_04;
  ExtensionSet *this_05;
  ExtensionSet *pEVar11;
  AllocatedData AVar12;
  ulong uVar13;
  Extension *unaff_R14;
  pair<google::protobuf::internal::ExtensionSet::Extension_*,_bool> pVar14;
  int iStack_c4;
  ulong uStack_c0;
  ExtensionSet EStack_b8;
  ulong uStack_a0;
  AllocatedData AStack_98;
  AllocatedData *pAStack_90;
  ExtensionSet *pEStack_88;
  ExtensionSet EStack_80;
  ulong uStack_68;
  FieldDescriptor *pFStack_60;
  Extension *pEStack_58;
  ThreadSafeArena *pTStack_50;
  undefined1 local_40 [16];
  
  if (message == (MessageLite *)0x0) {
    pTStack_50 = (ThreadSafeArena *)0x13b61f;
    pEVar4 = FindOrNull(this,number);
    if (pEVar4 == (Extension *)0x0) {
      return;
    }
    Extension::Clear(pEVar4);
    return;
  }
  uVar13 = CONCAT71(in_register_00000011,type) & 0xffffffff;
  this_00 = (ThreadSafeArena *)this->arena_;
  pTVar8 = (ThreadSafeArena *)(message->_internal_metadata_).ptr_;
  if (((ulong)pTVar8 & 1) != 0) {
    pTVar8 = *(ThreadSafeArena **)((ulong)pTVar8 & 0xfffffffffffffffe);
  }
  puVar5._1_7_ = (undefined7)((ulong)descriptor >> 8);
  puVar5._0_1_ = pTVar8 != this_00 && pTVar8 != (ThreadSafeArena *)0x0;
  AVar12 = (AllocatedData)message;
  if (puVar5._0_1_) {
    pTStack_50 = (ThreadSafeArena *)0x13b702;
    SetAllocatedMessage((ExtensionSet *)local_40);
LAB_0013b702:
    pTStack_50 = (ThreadSafeArena *)0x13b70c;
    SetAllocatedMessage((ExtensionSet *)local_40);
LAB_0013b70c:
    pTStack_50 = (ThreadSafeArena *)0x13b716;
    SetAllocatedMessage((ExtensionSet *)local_40);
LAB_0013b716:
    pTStack_50 = (ThreadSafeArena *)0x13b720;
    SetAllocatedMessage();
LAB_0013b720:
    this_04 = (ExtensionSet *)local_40;
    pTStack_50 = (ThreadSafeArena *)0x13b72a;
    SetAllocatedMessage(this_04);
  }
  else {
    pTStack_50 = (ThreadSafeArena *)0x13b5d3;
    pVar14 = Insert(this,number);
    unaff_R14 = pVar14.first;
    unaff_R14->descriptor = descriptor;
    if (((undefined1  [16])pVar14 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      unaff_R14->type = (FieldType)uVar13;
      if ((byte)(type - 0x13) < 0xee) goto LAB_0013b702;
      puVar5 = WireFormatLite::kFieldTypeToCppTypeMap;
      if (*(int *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)type * 4) == 10) {
        unaff_R14->is_repeated = false;
        unaff_R14->field_0xa = (unaff_R14->field_0xa & 0xfa) + 1;
LAB_0013b687:
        if (pTVar8 == this_00) {
          unaff_R14->field_0 = (anon_union_8_9_fdc4a54a_for_Extension_0)message;
        }
        else if (pTVar8 == (ThreadSafeArena *)0x0) {
          unaff_R14->field_0 = (anon_union_8_9_fdc4a54a_for_Extension_0)message;
          pTStack_50 = (ThreadSafeArena *)0x13b6d7;
          ThreadSafeArena::AddCleanup
                    (this_00,message,arena_delete_object<google::protobuf::MessageLite>);
        }
        else {
          pTStack_50 = (ThreadSafeArena *)0x13b69c;
          this_02 = (anon_union_8_9_fdc4a54a_for_Extension_0)
                    MessageLite::New(message,(Arena *)this_00);
          unaff_R14->field_0 = this_02;
          pTStack_50 = (ThreadSafeArena *)0x13b6aa;
          MessageLite::CheckTypeAndMergeFrom((MessageLite *)this_02,message);
        }
LAB_0013b6d7:
        unaff_R14->field_0xa = unaff_R14->field_0xa & 0xfd;
        return;
      }
      goto LAB_0013b716;
    }
    if (unaff_R14->is_repeated != false) goto LAB_0013b70c;
    puVar5._0_4_ = unaff_R14->type - 0x13;
    puVar5._4_4_ = 0;
    if ((byte)(uint)puVar5 < 0xee) goto LAB_0013b720;
    puVar5 = WireFormatLite::kFieldTypeToCppTypeMap;
    this_04 = (ExtensionSet *)
              (ulong)*(uint *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)unaff_R14->type * 4);
    if (*(uint *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)unaff_R14->type * 4) == 10) {
      if ((unaff_R14->field_0xa & 4) != 0) {
        pTStack_50 = (ThreadSafeArena *)0x13b6c0;
        (**(code **)(**(long **)&(unaff_R14->field_0).int32_t_value + 0x30))
                  (*(long **)&(unaff_R14->field_0).int32_t_value,message,this_00);
        goto LAB_0013b6d7;
      }
      if ((this_00 == (ThreadSafeArena *)0x0) &&
         ((long *)(unaff_R14->field_0).int64_t_value != (long *)0x0)) {
        pTStack_50 = (ThreadSafeArena *)0x13b687;
        (**(code **)(*(long *)(unaff_R14->field_0).int64_t_value + 8))();
      }
      goto LAB_0013b687;
    }
  }
  iVar9 = (int)local_40;
  pTStack_50 = (ThreadSafeArena *)UnsafeArenaSetAllocatedMessage;
  SetAllocatedMessage();
  this_05 = &EStack_80;
  pEVar10 = &EStack_80;
  EStack_80.map_ = (AllocatedData)message;
  uStack_68 = uVar13;
  pFStack_60 = descriptor;
  pEStack_58 = unaff_R14;
  pTStack_50 = this_00;
  if (AVar12.flat == (KeyValue *)0x0) {
    pEStack_88 = (ExtensionSet *)0x13b7a9;
    pEVar4 = FindOrNull(this_04,iVar9);
    if (pEVar4 == (Extension *)0x0) {
      return;
    }
    Extension::Clear(pEVar4);
    return;
  }
  pEStack_88 = (ExtensionSet *)0x13b75a;
  pVar14 = Insert(this_04,iVar9);
  pAVar3 = (AllocatedData *)pVar14.first;
  pAVar3[2] = (AllocatedData)puVar5;
  if (((undefined1  [16])pVar14 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    if (*(bool *)((long)pAVar3 + 9) != false) goto LAB_0013b830;
    if ((byte)(*(byte *)(pAVar3 + 1) - 0x13) < 0xee) goto LAB_0013b840;
    this_05 = (ExtensionSet *)
              (ulong)*(uint *)(WireFormatLite::kFieldTypeToCppTypeMap +
                              (ulong)*(byte *)(pAVar3 + 1) * 4);
    if (*(uint *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)*(byte *)(pAVar3 + 1) * 4) == 10)
    {
      if ((*(byte *)((long)pAVar3 + 10) & 4) != 0) {
        pEStack_88 = (ExtensionSet *)0x13b815;
        (**(code **)((pAVar3->large->
                     super_btree_map_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>_>
                     ).
                     super_btree_set_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>_>
                     .
                     super_btree_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>_>
                     .tree_.root_ + 0x38))(pAVar3->large,AVar12.flat,this_04->arena_);
        goto LAB_0013b815;
      }
      if ((this_04->arena_ == (Arena *)0x0) && (pAVar3->large != (LargeMap *)0x0)) {
        pEStack_88 = (ExtensionSet *)0x13b801;
        (**(code **)((pAVar3->large->
                     super_btree_map_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>_>
                     ).
                     super_btree_set_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>_>
                     .
                     super_btree_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>_>
                     .tree_.root_ + 8))();
      }
      goto LAB_0013b801;
    }
  }
  else {
    *(FieldType *)(pAVar3 + 1) = (FieldType)extraout_EDX;
    if ((byte)((FieldType)extraout_EDX - 0x13) < 0xee) {
      pEStack_88 = (ExtensionSet *)0x13b830;
      UnsafeArenaSetAllocatedMessage(&EStack_80);
LAB_0013b830:
      pEStack_88 = (ExtensionSet *)0x13b838;
      UnsafeArenaSetAllocatedMessage(&EStack_80);
    }
    else if (*(int *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)(extraout_EDX & 0xff) * 4) ==
             10) {
      *(bool *)((long)pAVar3 + 9) = false;
      *(byte *)((long)pAVar3 + 10) = (*(byte *)((long)pAVar3 + 10) & 0xfa) + 1;
LAB_0013b801:
      pAVar3->flat = (KeyValue *)AVar12;
LAB_0013b815:
      *(byte *)((long)pAVar3 + 10) = *(byte *)((long)pAVar3 + 10) & 0xfd;
      return;
    }
    pEStack_88 = (ExtensionSet *)0x13b840;
    UnsafeArenaSetAllocatedMessage();
LAB_0013b840:
    pEStack_88 = (ExtensionSet *)0x13b848;
    UnsafeArenaSetAllocatedMessage(&EStack_80);
  }
  pEStack_88 = (ExtensionSet *)ReleaseMessage;
  UnsafeArenaSetAllocatedMessage();
  pEVar11 = &EStack_b8;
  uStack_c0 = 0x13b86a;
  EStack_b8.map_ = AVar12;
  uStack_a0 = (ulong)extraout_EDX;
  AStack_98 = (AllocatedData)puVar5;
  pAStack_90 = pAVar3;
  pEStack_88 = this_04;
  pEVar4 = FindOrNull(this_05,(int)pEVar10);
  if (pEVar4 == (Extension *)0x0) {
    return;
  }
  if (pEVar4->is_repeated == false) {
    if (0xed < (byte)(pEVar4->type - 0x13)) {
      pEVar11 = (ExtensionSet *)
                (ulong)*(uint *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)pEVar4->type * 4);
      if (*(uint *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)pEVar4->type * 4) == 10) {
        pAVar1 = this_05->arena_;
        if ((pEVar4->field_0xa & 4) == 0) {
          if (pAVar1 != (Arena *)0x0) {
            uStack_c0 = 0x13b8bc;
            this_03 = MessageLite::New((MessageLite *)pEVar4->field_0,(Arena *)0x0);
            uStack_c0 = 0x13b8ca;
            MessageLite::CheckTypeAndMergeFrom(this_03,(MessageLite *)pEVar4->field_0);
          }
        }
        else {
          uStack_c0 = 0x13b8e0;
          (**(code **)(**(long **)&(pEVar4->field_0).int32_t_value + 0x40))
                    (*(long **)&(pEVar4->field_0).int32_t_value,extraout_RDX,pAVar1);
          if ((pAVar1 == (Arena *)0x0) && ((long *)(pEVar4->field_0).int64_t_value != (long *)0x0))
          {
            uStack_c0 = 0x13b8f6;
            (**(code **)(*(long *)(pEVar4->field_0).int64_t_value + 8))();
          }
        }
        uStack_c0 = 0x13b900;
        Erase(this_05,(int)pEVar10);
        return;
      }
      goto LAB_0013b921;
    }
  }
  else {
    uStack_c0 = 0x13b919;
    ReleaseMessage(&EStack_b8);
  }
  uStack_c0 = 0x13b921;
  ReleaseMessage(&EStack_b8);
LAB_0013b921:
  uStack_c0 = 0x13b929;
  iStack_c4 = (int)&EStack_b8;
  ReleaseMessage();
  sVar2 = *(short *)((long)pEVar11 + 10);
  this_01 = *(btree_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>_>
              **)((long)pEVar11 + 0x10);
  uStack_c0 = (ulong)pEVar10 & 0xffffffff;
  if ((long)sVar2 < 0) {
    absl::lts_20240722::container_internal::
    btree_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>_>
    ::erase<int>(this_01,&iStack_c4);
  }
  else if (sVar2 != 0) {
    lVar7 = (long)sVar2 * 0x20;
    lVar6 = 0;
    do {
      iVar9 = *(int *)((long)&(this_01->tree_).root_ + lVar6);
      if (iVar9 != iStack_c4 && iStack_c4 <= iVar9) {
        return;
      }
      if (iVar9 == iStack_c4) {
        if (lVar7 + -0x20 != lVar6) {
          memmove((void *)((long)&(this_01->tree_).root_ + lVar6),
                  (void *)((long)&this_01[1].tree_.rightmost_.
                                  super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::key_compare_adapter<std::less<int>,_int>::checked_compare,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>_*>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>,_true>
                                  .
                                  super_Storage<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>_*,_2UL,_false>
                                  .value + lVar6),(lVar7 - lVar6) - 0x20);
          sVar2 = *(short *)((long)pEVar11 + 10);
        }
        *(short *)((long)pEVar11 + 10) = sVar2 + -1;
        return;
      }
      lVar6 = lVar6 + 0x20;
    } while (lVar7 != lVar6);
  }
  return;
}

Assistant:

void ExtensionSet::SetAllocatedMessage(int number, FieldType type,
                                       const FieldDescriptor* descriptor,
                                       MessageLite* message) {
  if (message == nullptr) {
    ClearExtension(number);
    return;
  }
  Arena* const arena = arena_;
  Arena* const message_arena = message->GetArena();
  ABSL_DCHECK(message_arena == nullptr || message_arena == arena);

  Extension* extension;
  if (MaybeNewExtension(number, descriptor, &extension)) {
    extension->type = type;
    ABSL_DCHECK_EQ(cpp_type(extension->type), WireFormatLite::CPPTYPE_MESSAGE);
    extension->is_repeated = false;
    extension->is_pointer = true;
    extension->is_lazy = false;
    if (message_arena == arena) {
      extension->ptr.message_value = message;
    } else if (message_arena == nullptr) {
      extension->ptr.message_value = message;
      arena->Own(message);  // not nullptr because not equal to message_arena
    } else {
      extension->ptr.message_value = message->New(arena);
      extension->ptr.message_value->CheckTypeAndMergeFrom(*message);
    }
  } else {
    ABSL_DCHECK_TYPE(*extension, OPTIONAL_FIELD, MESSAGE);
    if (extension->is_lazy) {
      extension->ptr.lazymessage_value->SetAllocatedMessage(message, arena);
    } else {
      if (arena == nullptr) {
        delete extension->ptr.message_value;
      }
      if (message_arena == arena) {
        extension->ptr.message_value = message;
      } else if (message_arena == nullptr) {
        extension->ptr.message_value = message;
        arena->Own(message);  // not nullptr because not equal to message_arena
      } else {
        extension->ptr.message_value = message->New(arena);
        extension->ptr.message_value->CheckTypeAndMergeFrom(*message);
      }
    }
  }
  extension->is_cleared = false;
}